

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O1

int xmlSchemaFixupSimpleTypeStageOne(xmlSchemaParserCtxtPtr pctxt,xmlSchemaTypePtr type)

{
  byte *pbVar1;
  uint uVar2;
  xmlSchemaTypePtr type_00;
  int iVar3;
  char *message;
  xmlChar *in_R8;
  
  if (type->type != XML_SCHEMA_TYPE_SIMPLE) {
    return 0;
  }
  uVar2 = type->flags;
  if ((uVar2 >> 0x1d & 1) != 0) {
    return 0;
  }
  type->flags = uVar2 | 0x20000000;
  if ((uVar2 & 0x40) == 0) {
    if ((char)uVar2 < '\0') {
      if (type->memberTypes != (xmlSchemaTypeLinkPtr)0x0) {
        return 0;
      }
      message = "union type has no member-types assigned";
    }
    else {
      type_00 = type->baseType;
      if (type_00 != (xmlSchemaTypePtr)0x0) {
        if (((type_00->type != XML_SCHEMA_TYPE_BASIC) && ((type_00->flags & 0x20000000) == 0)) &&
           (iVar3 = xmlSchemaFixupSimpleTypeStageOne(pctxt,type_00), iVar3 == -1)) {
          return -1;
        }
        uVar2 = type->baseType->flags;
        if ((uVar2 >> 8 & 1) != 0) {
          pbVar1 = (byte *)((long)&type->flags + 1);
          *pbVar1 = *pbVar1 | 1;
          return 0;
        }
        if ((uVar2 & 0x40) != 0) {
          *(byte *)&type->flags = (byte)type->flags | 0x40;
          type->subtypes = type->baseType->subtypes;
          return 0;
        }
        if ((char)uVar2 < '\0') {
          *(byte *)&type->flags = (byte)type->flags | 0x80;
          return 0;
        }
        return 0;
      }
      message = "type has no base-type assigned";
    }
  }
  else {
    if (type->subtypes != (xmlSchemaTypePtr)0x0) {
      return 0;
    }
    message = "list type has no item-type assigned";
  }
  xmlSchemaInternalErr2
            ((xmlSchemaAbstractCtxtPtr)pctxt,"xmlSchemaFixupSimpleTypeStageOne",message,
             (xmlChar *)0x0,in_R8);
  return -1;
}

Assistant:

static int
xmlSchemaFixupSimpleTypeStageOne(xmlSchemaParserCtxtPtr pctxt,
			  xmlSchemaTypePtr type)
{
    if (type->type != XML_SCHEMA_TYPE_SIMPLE)
	return(0);
    if (! WXS_IS_TYPE_NOT_FIXED_1(type))
	return(0);
    type->flags |= XML_SCHEMAS_TYPE_FIXUP_1;

    if (WXS_IS_LIST(type)) {
	/*
	* Corresponds to <simpleType><list>...
	*/
	if (type->subtypes == NULL) {
	    /*
	    * This one is really needed, so get out.
	    */
	    PERROR_INT("xmlSchemaFixupSimpleTypeStageOne",
		"list type has no item-type assigned");
	    return(-1);
	}
    } else if (WXS_IS_UNION(type)) {
	/*
	* Corresponds to <simpleType><union>...
	*/
	if (type->memberTypes == NULL) {
	    /*
	    * This one is really needed, so get out.
	    */
	    PERROR_INT("xmlSchemaFixupSimpleTypeStageOne",
		"union type has no member-types assigned");
	    return(-1);
	}
    } else {
	/*
	* Corresponds to <simpleType><restriction>...
	*/
	if (type->baseType == NULL) {
	    PERROR_INT("xmlSchemaFixupSimpleTypeStageOne",
		"type has no base-type assigned");
	    return(-1);
	}
	if (WXS_IS_TYPE_NOT_FIXED_1(type->baseType))
	    if (xmlSchemaFixupSimpleTypeStageOne(pctxt, type->baseType) == -1)
		return(-1);
	/*
	* Variety
	* If the <restriction> alternative is chosen, then the
	* {variety} of the {base type definition}.
	*/
	if (WXS_IS_ATOMIC(type->baseType))
	    type->flags |= XML_SCHEMAS_TYPE_VARIETY_ATOMIC;
	else if (WXS_IS_LIST(type->baseType)) {
	    type->flags |= XML_SCHEMAS_TYPE_VARIETY_LIST;
	    /*
	    * Inherit the itemType.
	    */
	    type->subtypes = type->baseType->subtypes;
	} else if (WXS_IS_UNION(type->baseType)) {
	    type->flags |= XML_SCHEMAS_TYPE_VARIETY_UNION;
	    /*
	    * NOTE that we won't assign the memberTypes of the base,
	    * since this will make trouble when freeing them; we will
	    * use a lookup function to access them instead.
	    */
	}
    }
    return(0);
}